

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O1

void ear::dsp::LinearInterpVector::apply_interp
               (float **in,float **out,SampleIndex range_start,SampleIndex range_end,
               SampleIndex block_start,SampleIndex start,SampleIndex end,Point *start_point,
               Point *end_point)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  SampleIndex SVar9;
  float fVar10;
  
  pfVar3 = (start_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(start_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 2;
    pfVar4 = (end_point->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      if (range_start < range_end) {
        fVar1 = pfVar3[lVar7];
        fVar2 = pfVar4[lVar7];
        pfVar5 = *in;
        pfVar6 = out[lVar7];
        SVar9 = range_start;
        do {
          fVar10 = (float)((block_start - start) + SVar9) * (1.0 / (float)(end - start));
          pfVar6[SVar9] = (fVar10 * fVar2 + (1.0 - fVar10) * fVar1) * pfVar5[SVar9];
          SVar9 = SVar9 + 1;
        } while (range_end != SVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar8 + (ulong)(lVar8 == 0));
  }
  return;
}

Assistant:

static void apply_interp(const float *const *in, float *const *out,
                               SampleIndex range_start, SampleIndex range_end,
                               SampleIndex block_start, SampleIndex start,
                               SampleIndex end, const Point &start_point,
                               const Point &end_point) {
        float scale = 1.0f / (end - start);

        for (size_t channel = 0; channel < start_point.size(); channel++) {
          float s = start_point[channel];
          float e = end_point[channel];

          for (SampleIndex i = range_start; i < range_end; i++) {
            float p = (float)((block_start + i) - start) * scale;
            float gain = (1.0f - p) * s + p * e;
            out[channel][i] = in[0][i] * gain;
          }
        }
      }